

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

void __thiscall
tinyusdz::TypedTimeSamples<tinyusdz::value::vector3f>::add_blocked_sample
          (TypedTimeSamples<tinyusdz::value::vector3f> *this,double t)

{
  pointer *ppSVar1;
  iterator __position;
  Sample local_20;
  
  local_20.blocked = true;
  __position._M_current =
       (this->_samples).
       super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::vector3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::vector3f>::Sample>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->_samples).
      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::vector3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::vector3f>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_20.t = t;
    ::std::
    vector<tinyusdz::TypedTimeSamples<tinyusdz::value::vector3f>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::vector3f>::Sample>>
    ::_M_realloc_insert<tinyusdz::TypedTimeSamples<tinyusdz::value::vector3f>::Sample&>
              ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::vector3f>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::vector3f>::Sample>>
                *)this,__position,&local_20);
  }
  else {
    *(ulong *)&((__position._M_current)->value).z = CONCAT44(local_20._20_4_,local_20.value.z);
    (__position._M_current)->t = t;
    ((__position._M_current)->value).x = local_20.value.x;
    ((__position._M_current)->value).y = local_20.value.y;
    ppSVar1 = &(this->_samples).
               super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::vector3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::vector3f>::Sample>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  this->_dirty = true;
  return;
}

Assistant:

void add_blocked_sample(const double t) {
    Sample s;
    s.t = t;
    s.blocked = true;
    _samples.emplace_back(s);
    _dirty = true;
  }